

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O0

void __thiscall Cache::initCache(Cache *this)

{
  vector<Cache::Block,_std::allocator<Cache::Block>_> *this_00;
  allocator_type *__a;
  allocator_type *paVar1;
  size_type in_RDI;
  Block *b;
  uint32_t i;
  vector<Cache::Block,_std::allocator<Cache::Block>_> *in_stack_ffffffffffffff78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  allocator_type *in_stack_ffffffffffffff80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_59;
  reference local_40;
  uint local_38;
  
  this_00 = (vector<Cache::Block,_std::allocator<Cache::Block>_> *)(ulong)*(uint *)(in_RDI + 0x38);
  std::allocator<Cache::Block>::allocator((allocator<Cache::Block> *)0x126243);
  std::vector<Cache::Block,_std::allocator<Cache::Block>_>::vector
            (this_00,in_RDI,in_stack_ffffffffffffff80);
  std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator=
            ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  std::vector<Cache::Block,_std::allocator<Cache::Block>_>::~vector
            ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)in_stack_ffffffffffffff80);
  std::allocator<Cache::Block>::~allocator((allocator<Cache::Block> *)0x126280);
  local_38 = 0;
  while( true ) {
    __a = (allocator_type *)(ulong)local_38;
    paVar1 = (allocator_type *)
             std::vector<Cache::Block,_std::allocator<Cache::Block>_>::size
                       ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)(in_RDI + 0x48));
    if (paVar1 <= __a) break;
    local_40 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                         ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)(in_RDI + 0x48),
                          (ulong)local_38);
    local_40->valid = false;
    local_40->modified = false;
    local_40->size = *(uint32_t *)(in_RDI + 0x34);
    local_40->tag = 0;
    local_40->id = local_38 / *(uint *)(in_RDI + 0x3c);
    local_40->lastReference = 0;
    __x = &local_59;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x126333);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,in_RDI,__a);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a,__x);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x126370);
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

void Cache::initCache() {
  this->blocks = std::vector<Block>(policy.blockNum);
  for (uint32_t i = 0; i < this->blocks.size(); ++i) {
    Block &b = this->blocks[i];
    b.valid = false;
    b.modified = false;
    b.size = policy.blockSize;
    b.tag = 0;
    b.id = i / policy.associativity;
    b.lastReference = 0;
    b.data = std::vector<uint8_t>(b.size);
  }
}